

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void ClownLZSS::Internal::
     ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,512u,512u,_1>>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>
               *output,_func_void_DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_ptr_DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>_ptr
                       *decompression_function,size_t module_alignment)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  
  uVar6 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    bVar2 = std::istream::get();
    uVar6 = (ulong)bVar2 | uVar6 << 8;
    bVar1 = false;
  } while (bVar5);
  lVar3 = std::istream::tellg();
  uVar6 = uVar6 + 0xfff >> 0xc;
  while (uVar6 = uVar6 - 1, uVar6 != 0) {
    (*decompression_function)(input,output);
    lVar4 = std::istream::tellg();
    std::istream::seekg((long)(input->
                              super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ).input,
                        (_Ios_Seekdir)
                        ((module_alignment - (ulong)(lVar4 - lVar3) % module_alignment) %
                        module_alignment));
  }
  (*decompression_function)(input,output);
  return;
}

Assistant:

void ModuledDecompressionWrapper(DecompressorInput<T1> &input, T2 &output, void (* const decompression_function)(DecompressorInput<T1> &input, T2 &output), const std::size_t module_alignment)
		{
			const auto header = input.template Read<total_bytes, endian>();

			const auto input_start_position = input.Tell();

			const unsigned long total_modules = (header + (0x1000 - 1)) / 0x1000; // Round up.

			for (unsigned long i = 0; i < total_modules - 1; ++i)
			{
				decompression_function(input, output);
				input += (module_alignment - (input.Distance(input_start_position) % module_alignment)) % module_alignment;
				output.Reset();
			}

			decompression_function(input, output);
		}